

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalCreateFile
                    (CPalThread *pThread,LPCSTR lpFileName,DWORD dwDesiredAccess,DWORD dwShareMode,
                    LPSECURITY_ATTRIBUTES lpSecurityAttributes,DWORD dwCreationDisposition,
                    DWORD dwFlagsAndAttributes,HANDLE hTemplateFile,HANDLE *phFile)

{
  FILE *__stream;
  bool bVar1;
  uint uVar2;
  errno_t eVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  uint *puVar7;
  int *piVar8;
  bool bVar9;
  undefined1 local_140 [8];
  stat st;
  char *pcStack_a8;
  DWORD cchFullUnixPath;
  LPSTR lpFullUnixPath;
  char *szNonfilePrefix;
  BOOL bFileCreated;
  int lock_mode;
  int open_flags;
  int create_flags;
  int filed;
  LPSTR lpUnixPath;
  BOOL inheritable;
  BOOL fFileExists;
  CObjectAttributes oaFile;
  IFileLockController *pLockController;
  CFileProcessLocalData *pLocalData;
  IDataLock *pDataLock;
  IPalObject *pRegisteredFile;
  IPalObject *pFileObject;
  PAL_ERROR palError;
  DWORD dwCreationDisposition_local;
  LPSECURITY_ATTRIBUTES lpSecurityAttributes_local;
  DWORD dwShareMode_local;
  DWORD dwDesiredAccess_local;
  LPCSTR lpFileName_local;
  CPalThread *pThread_local;
  
  pFileObject._0_4_ = 0;
  pRegisteredFile = (IPalObject *)0x0;
  pDataLock = (IDataLock *)0x0;
  pLocalData = (CFileProcessLocalData *)0x0;
  pLockController = (IFileLockController *)0x0;
  oaFile.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  pFileObject._4_4_ = dwCreationDisposition;
  _palError = lpSecurityAttributes;
  lpSecurityAttributes_local._0_4_ = dwShareMode;
  lpSecurityAttributes_local._4_4_ = dwDesiredAccess;
  _dwShareMode_local = lpFileName;
  lpFileName_local = (LPCSTR)pThread;
  CObjectAttributes::CObjectAttributes
            ((CObjectAttributes *)&inheritable,(WCHAR *)0x0,lpSecurityAttributes);
  bVar9 = false;
  lpUnixPath._0_4_ = 0;
  _create_flags = (char *)0x0;
  open_flags = -1;
  bFileCreated = 0;
  bVar1 = false;
  pcStack_a8 = (char *)0x0;
  st.__glibc_reserved[2]._4_4_ = 0x1001;
  if (((DWORD)lpSecurityAttributes_local & 0xfffffff8) == 0) {
    if (_dwShareMode_local == (char *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      pFileObject._0_4_ = 3;
    }
    else {
      sVar5 = strlen(_dwShareMode_local);
      pcVar6 = _dwShareMode_local;
      if (sVar5 < 0x400) {
        sVar5 = strlen("\\\\.\\");
        iVar4 = strncmp(pcVar6,"\\\\.\\",sVar5);
        if (iVar4 == 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          pFileObject._0_4_ = 0x57;
        }
        else {
          _create_flags = InternalStrdup(_dwShareMode_local);
          if (_create_flags == (char *)0x0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            pFileObject._0_4_ = 8;
          }
          else {
            pcVar6 = (char *)InternalMalloc((ulong)st.__glibc_reserved[2]._4_4_);
            pcStack_a8 = pcVar6;
            if (pcVar6 == (char *)0x0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              pFileObject._0_4_ = 8;
            }
            else {
              memset(pcVar6,0,(ulong)st.__glibc_reserved[2]._4_4_);
              FILEDosToUnixPathA(_create_flags);
              pFileObject._0_4_ =
                   InternalCanonicalizeRealPath(_create_flags,pcVar6,st.__glibc_reserved[2]._4_4_);
              if ((PAL_ERROR)pFileObject == 0) {
                InternalFree(_create_flags);
                pcStack_a8 = (char *)0x0;
                _create_flags = pcVar6;
                if (lpSecurityAttributes_local._4_4_ == 0xc0000000) {
                  bFileCreated = 2;
                }
                else if (lpSecurityAttributes_local._4_4_ != 0) {
                  if (lpSecurityAttributes_local._4_4_ != 0x40000000) {
                    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                      abort();
                    }
                    pFileObject._0_4_ = 0x57;
                    goto LAB_0013c5f1;
                  }
                  bFileCreated = 1;
                }
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
                if (_palError != (LPSECURITY_ATTRIBUTES)0x0) {
                  if (((_palError->nLength != 0x18) ||
                      (_palError->lpSecurityDescriptor != (LPVOID)0x0)) ||
                     (_palError->bInheritHandle == 0)) {
                    fprintf(_stderr,"] %s %s:%d","InternalCreateFile",
                            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                            ,0x246);
                    fprintf(_stderr,"lpSecurityAttributes points to invalid values.\n");
                    pFileObject._0_4_ = 0x57;
                    goto LAB_0013c5f1;
                  }
                  lpUnixPath._0_4_ = 1;
                }
                if ((dwFlagsAndAttributes & 0xba000080) == dwFlagsAndAttributes) {
                  if ((dwFlagsAndAttributes & 0x2000000) == 0) {
                    iVar4 = stat64(pcVar6,(stat64 *)local_140);
                    if ((iVar4 == 0) && (((uint)st.st_nlink & 0x4000) != 0)) {
                      pFileObject._0_4_ = 5;
                      goto LAB_0013c5f1;
                    }
                  }
                  else {
                    bFileCreated = 0;
                  }
                  if (hTemplateFile == (HANDLE)0x0) {
                    pFileObject._0_4_ =
                         (*(code *)**(undefined8 **)g_pFileLockManager)
                                   (g_pFileLockManager,lpFileName_local,pcVar6,
                                    lpSecurityAttributes_local._4_4_,
                                    (DWORD)lpSecurityAttributes_local,&oaFile.pSecurityAttributes);
                    if ((PAL_ERROR)pFileObject == 0) {
                      switch(pFileObject._4_4_) {
                      case 1:
                        bFileCreated = bFileCreated | 0xc0;
                        break;
                      case 2:
                        iVar4 = access(pcVar6,0);
                        bVar9 = iVar4 == 0;
                        bFileCreated = bFileCreated | 0x240;
                        break;
                      case 3:
                        break;
                      case 4:
                        iVar4 = access(pcVar6,0);
                        bVar9 = iVar4 == 0;
                        bFileCreated = bFileCreated | 0x40;
                        break;
                      case 5:
                        bFileCreated = bFileCreated | 0x200;
                        break;
                      default:
                        fprintf(_stderr,"] %s %s:%d","InternalCreateFile",
                                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                                ,0x2a6);
                        fprintf(_stderr,"dwCreationDisposition value of %d is not valid\n",
                                (ulong)pFileObject._4_4_);
                        pFileObject._0_4_ = 0x57;
                        goto LAB_0013c5f1;
                      }
                      if ((dwFlagsAndAttributes & 0x20000000) == 0) {
                        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                          abort();
                        }
                      }
                      else {
                        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                          abort();
                        }
                        bFileCreated = bFileCreated | 0x4000;
                      }
                      open_flags = InternalOpen(pcVar6,bFileCreated,0x1a4);
                      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                        abort();
                      }
                      if (open_flags < 0) {
                        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                          abort();
                        }
                        piVar8 = __errno_location();
                        strerror(*piVar8);
                        pFileObject._0_4_ = FILEGetLastErrorFromErrnoAndFilename(pcVar6);
                      }
                      else {
                        if (((pFileObject._4_4_ == 2) || (pFileObject._4_4_ == 1)) ||
                           (bVar1 = false, pFileObject._4_4_ == 4)) {
                          bVar1 = (bool)(bVar9 ^ 1);
                        }
                        uVar2 = 1;
                        if ((DWORD)lpSecurityAttributes_local == 0) {
                          uVar2 = 2;
                        }
                        iVar4 = flock(open_flags,uVar2 | 4);
                        if (iVar4 == 0) {
                          iVar4 = fcntl64(open_flags,2,1);
                          if (iVar4 == -1) {
                            fprintf(_stderr,"] %s %s:%d","InternalCreateFile",
                                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                                    ,0x2f6);
                            __stream = _stderr;
                            puVar7 = (uint *)__errno_location();
                            uVar2 = *puVar7;
                            piVar8 = __errno_location();
                            pcVar6 = strerror(*piVar8);
                            fprintf(__stream,
                                    "can\'t set close-on-exec flag; fcntl() failed. errno is %d (%s)\n"
                                    ,(ulong)uVar2,pcVar6);
                            pFileObject._0_4_ = 0x54f;
                          }
                          else {
                            pFileObject._0_4_ =
                                 (**(code **)*g_pObjectManager)
                                           (g_pObjectManager,lpFileName_local,otFile,&inheritable,
                                            &pRegisteredFile);
                            if (((PAL_ERROR)pFileObject == 0) &&
                               (pFileObject._0_4_ =
                                     (*pRegisteredFile->_vptr_IPalObject[3])
                                               (pRegisteredFile,lpFileName_local,1,&pLocalData,
                                                &pLockController), (PAL_ERROR)pFileObject == 0)) {
                              eVar3 = strcpy_s((char *)(pLockController + 3),0x1000,pcVar6);
                              if (eVar3 == 0) {
                                *(undefined4 *)&pLockController[0x203]._vptr_IFileLockController =
                                     lpUnixPath._0_4_;
                                *(int *)&pLockController[1]._vptr_IFileLockController = open_flags;
                                *(DWORD *)((long)&pLockController[1]._vptr_IFileLockController + 4)
                                     = lpSecurityAttributes_local._4_4_;
                                *(BOOL *)&pLockController[2]._vptr_IFileLockController =
                                     bFileCreated;
                                *(uint *)((long)&pLockController[2]._vptr_IFileLockController + 4) =
                                     (uint)(lpSecurityAttributes_local._4_4_ == 0);
                                pLockController->_vptr_IFileLockController =
                                     (_func_int **)oaFile.pSecurityAttributes;
                                oaFile.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
                                (*(code *)pLocalData->pLockController->_vptr_IFileLockController)
                                          (pLocalData,lpFileName_local,1);
                                pLocalData = (CFileProcessLocalData *)0x0;
                                pFileObject._0_4_ =
                                     (**(code **)(*g_pObjectManager + 8))
                                               (g_pObjectManager,lpFileName_local,pRegisteredFile,
                                                aotFile,lpSecurityAttributes_local._4_4_,phFile,
                                                &pDataLock);
                                pRegisteredFile = (IPalObject *)0x0;
                              }
                              else {
                                pFileObject._0_4_ = 0x7a;
                                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                                  abort();
                                }
                              }
                            }
                          }
                        }
                        else {
                          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                            abort();
                          }
                          piVar8 = __errno_location();
                          strerror(*piVar8);
                          piVar8 = __errno_location();
                          if (*piVar8 == 0xb) {
                            pFileObject._0_4_ = 0x20;
                          }
                          else {
                            pFileObject._0_4_ = FILEGetLastErrorFromErrno();
                          }
                        }
                      }
                    }
                  }
                  else {
                    fprintf(_stderr,"] %s %s:%d","InternalCreateFile",
                            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                            ,0x26a);
                    fprintf(_stderr,"hTemplateFile is not NULL, as it should be.\n");
                    pFileObject._0_4_ = 0x57;
                  }
                }
                else {
                  fprintf(_stderr,"] %s %s:%d","InternalCreateFile",
                          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                          ,0x250);
                  fprintf(_stderr,"Bad dwFlagsAndAttributes\n");
                  pFileObject._0_4_ = 0x57;
                }
              }
            }
          }
        }
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        pFileObject._0_4_ = 0xce;
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x1ec);
    fprintf(_stderr,"dwShareMode is invalid\n");
    pFileObject._0_4_ = 0x57;
  }
LAB_0013c5f1:
  if ((PAL_ERROR)pFileObject != 0) {
    if (-1 < open_flags) {
      close(open_flags);
    }
    if ((bVar1) && (iVar4 = unlink(_create_flags), iVar4 == -1)) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar8 = __errno_location();
      strerror(*piVar8);
    }
  }
  if (oaFile.pSecurityAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
    (**(code **)(*(long *)oaFile.pSecurityAttributes + 0x18))();
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,lpFileName_local,1)
    ;
  }
  if (pRegisteredFile != (IPalObject *)0x0) {
    (*pRegisteredFile->_vptr_IPalObject[8])(pRegisteredFile,lpFileName_local);
  }
  if (pDataLock != (IDataLock *)0x0) {
    (*pDataLock->_vptr_IDataLock[8])(pDataLock,lpFileName_local);
  }
  if (_create_flags != (char *)0x0) {
    InternalFree(_create_flags);
  }
  if (pcStack_a8 != (char *)0x0) {
    InternalFree(pcStack_a8);
  }
  if (((PAL_ERROR)pFileObject == 0) && (bVar9)) {
    pFileObject._0_4_ = 0xb7;
  }
  return (PAL_ERROR)pFileObject;
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateFile(
    CPalThread *pThread,
    LPCSTR lpFileName,
    DWORD dwDesiredAccess,
    DWORD dwShareMode,
    LPSECURITY_ATTRIBUTES lpSecurityAttributes,
    DWORD dwCreationDisposition,
    DWORD dwFlagsAndAttributes,
    HANDLE hTemplateFile,
    HANDLE *phFile
    )
{
    PAL_ERROR palError = 0;
    IPalObject *pFileObject = NULL;
    IPalObject *pRegisteredFile = NULL;
    IDataLock *pDataLock = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IFileLockController *pLockController = NULL;
    CObjectAttributes oaFile(NULL, lpSecurityAttributes);
    BOOL fFileExists = FALSE;

    BOOL inheritable = FALSE;
    LPSTR lpUnixPath = NULL;
    int   filed = -1;
    int   create_flags = (S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);
    int   open_flags = 0;
    int   lock_mode = LOCK_SH;

    // track whether we've created the file with the intended name,
    // so that it can be removed on failure exit
    BOOL bFileCreated = FALSE;

    const char* szNonfilePrefix = "\\\\.\\";
    LPSTR lpFullUnixPath = NULL;
    DWORD cchFullUnixPath = PATH_MAX+1; // InternalCanonicalizeRealPath requires this to be at least PATH_MAX

    /* for dwShareMode only three flags are accepted */
    if ( dwShareMode & ~(FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE) )
    {
        ASSERT( "dwShareMode is invalid\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    if ( lpFileName == NULL )
    {
        ERROR("InternalCreateFile called with NULL filename\n");
        palError = ERROR_PATH_NOT_FOUND;
        goto done;
    }

    if ( strlen(lpFileName) >= MAX_LONGPATH )
    {
        WARN("InternalCreateFile called with a filename whose size is "
                "%d >= MAX_LONGPATH (%d)\n", strlen(lpFileName), MAX_LONGPATH);
        palError = ERROR_FILENAME_EXCED_RANGE;
        goto done;
    }

    if ( strncmp(lpFileName, szNonfilePrefix, strlen(szNonfilePrefix)) == 0 )
    {
        ERROR("InternalCreateFile does not support paths beginning with %s\n", szNonfilePrefix);
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    lpUnixPath = InternalStrdup(lpFileName);
    if ( lpUnixPath == NULL )
    {
        ERROR("InternalStrdup() failed\n");
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }

    lpFullUnixPath =  reinterpret_cast<LPSTR>(InternalMalloc(cchFullUnixPath));
    if ( lpFullUnixPath == NULL )
    {
        ERROR("InternalMalloc() failed\n");
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }

    // Initialize the path to zeroes...
    ZeroMemory(lpFullUnixPath, cchFullUnixPath);
    
    FILEDosToUnixPathA( lpUnixPath );

    // Compute the absolute pathname to the file.  This pathname is used
    // to determine if two file names represent the same file.
    palError = InternalCanonicalizeRealPath(lpUnixPath, lpFullUnixPath, cchFullUnixPath);
    if (palError != NO_ERROR)
    {
        goto done;
    }

    InternalFree(lpUnixPath);
    lpUnixPath = lpFullUnixPath;
    lpFullUnixPath = NULL;

    switch( dwDesiredAccess )
    {
    case 0:
        /* Device Query Access was requested. let's use open() with 
           no flags, it's basically the equivalent of O_RDONLY, since 
           O_RDONLY is defined as 0x0000 */
        break;
    case( GENERIC_READ ):
        open_flags |= O_RDONLY;
        break;
    case( GENERIC_WRITE ):
        open_flags |= O_WRONLY;
        break;
    case( GENERIC_READ | GENERIC_WRITE ):
        open_flags |= O_RDWR;
        break;
    default:
        ERROR("dwDesiredAccess value of %d is invalid\n", dwDesiredAccess);
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    TRACE("open flags are 0x%lx\n", open_flags);
    
    if ( lpSecurityAttributes )
    {
        if ( lpSecurityAttributes->nLength != sizeof( SECURITY_ATTRIBUTES ) ||
             lpSecurityAttributes->lpSecurityDescriptor != NULL ||
             !lpSecurityAttributes->bInheritHandle )
        {
            ASSERT("lpSecurityAttributes points to invalid values.\n");
            palError = ERROR_INVALID_PARAMETER;
            goto done;
        }
        inheritable = TRUE;
    }

    if ( (dwFlagsAndAttributes & PAL_LEGAL_FLAGS_ATTRIBS) !=
          dwFlagsAndAttributes)
    {
        ASSERT("Bad dwFlagsAndAttributes\n");
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    } 
    else if (dwFlagsAndAttributes & FILE_FLAG_BACKUP_SEMANTICS)
    {
        /* Override the open flags, and always open as readonly.  This
           flag is used when opening a directory, to change its
           creation/modification/access times.  On Windows, the directory
           must be open for write, but on Unix, it needs to be readonly. */
        open_flags = O_RDONLY;
    } else {
        struct stat st;

        if (stat(lpUnixPath, &st) == 0 && (st.st_mode & S_IFDIR))
        {
            /* The file exists and it is a directory.  Without
                   FILE_FLAG_BACKUP_SEMANTICS, Win32 CreateFile always fails
                   to open directories. */
                palError = ERROR_ACCESS_DENIED;
                goto done;
        }
    }

    if ( hTemplateFile )
    {
        ASSERT("hTemplateFile is not NULL, as it should be.\n");
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    //
    // The file sharing mode checks are performed by the lock manager so we need
    // to get the lock controller for this file.
    // Do this before modifying the file system since we wouldn't want to, for
    // instance, truncate a file before finding out if we have write access to it.
    // It may seem odd that in some cases we will acquire a lock on a file that
    // doesn't exist yet but the lock manager does not care -- files are
    // abstract entities represented by a name from its point of view.
    //

    palError = g_pFileLockManager->GetLockControllerForFile(
        pThread, 
        lpUnixPath,
        dwDesiredAccess,
        dwShareMode,
        &pLockController
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    /* NB: According to MSDN docs, When CREATE_ALWAYS or OPEN_ALWAYS is
       set, CreateFile should SetLastError to ERROR_ALREADY_EXISTS,
       even though/if CreateFile will be successful.
    */
    switch( dwCreationDisposition )
    {
    case( CREATE_ALWAYS ):        
        // check whether the file exists
        if ( access( lpUnixPath, F_OK ) == 0 )
        {
            fFileExists = TRUE;
        }
        open_flags |= O_CREAT | O_TRUNC;
        break;
    case( CREATE_NEW ):
        open_flags |= O_CREAT | O_EXCL;
        break;
    case( OPEN_EXISTING ):
        /* don't need to do anything here */
        break;
    case( OPEN_ALWAYS ):
        if ( access( lpUnixPath, F_OK ) == 0 )
        {
            fFileExists = TRUE;
        }
        open_flags |= O_CREAT;
        break;
    case( TRUNCATE_EXISTING ):
        open_flags |= O_TRUNC;
        break;
    default:
        ASSERT("dwCreationDisposition value of %d is not valid\n",
              dwCreationDisposition);
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    if ( dwFlagsAndAttributes & FILE_FLAG_NO_BUFFERING )
    {
        TRACE("I/O will be unbuffered\n");
#ifdef O_DIRECT
        open_flags |= O_DIRECT;
#endif
    }
    else
    {
        TRACE("I/O will be buffered\n");
    }

    filed = InternalOpen(lpUnixPath, open_flags, create_flags);
    TRACE("Allocated file descriptor [%d]\n", filed);

    if ( filed < 0 )
    {
        TRACE("open() failed; error is %s (%d)\n", strerror(errno), errno);
        palError = FILEGetLastErrorFromErrnoAndFilename(lpUnixPath);
        goto done;
    }

    // Deduce whether we created a file in the previous operation (there's a
    // small timing window between the access() used to determine fFileExists
    // and the open() operation, but there's not much we can do about that.
    bFileCreated = (dwCreationDisposition == CREATE_ALWAYS ||
                    dwCreationDisposition == CREATE_NEW ||
                    dwCreationDisposition == OPEN_ALWAYS) &&
        !fFileExists;


    // While the lock manager is able to provide support for share modes within an instance of
    // the PAL, other PALs will ignore these locks.  In order to support a basic level of cross
    // process locking, we'll use advisory locks.  FILE_SHARE_NONE implies a exclusive lock on the
    // file and all other modes use a shared lock.  While this is not as granular as Windows,
    // you can at least implement a lock file using this.
    lock_mode = (dwShareMode == 0 /* FILE_SHARE_NONE */) ? LOCK_EX : LOCK_SH;

    if(flock(filed, lock_mode | LOCK_NB) != 0) 
    {
        TRACE("flock() failed; error is %s (%d)\n", strerror(errno), errno);
        if (errno == EWOULDBLOCK) 
        {
            palError = ERROR_SHARING_VIOLATION;
        }
        else
        {
            palError = FILEGetLastErrorFromErrno();
        }

        goto done;
    }

#ifndef O_DIRECT
    if ( dwFlagsAndAttributes & FILE_FLAG_NO_BUFFERING )
    {
#ifdef F_NOCACHE
        if (-1 == fcntl(filed, F_NOCACHE, 1))
        {
            ASSERT("Can't set F_NOCACHE; fcntl() failed. errno is %d (%s)\n",
               errno, strerror(errno));
            palError = ERROR_INTERNAL_ERROR;
            goto done;
        }
#else
#error Insufficient support for uncached I/O on this platform
#endif
    }
#endif
    
    /* make file descriptor close-on-exec; inheritable handles will get
      "uncloseonexeced" in CreateProcess if they are actually being inherited*/
    if(-1 == fcntl(filed,F_SETFD,1))
    {
        ASSERT("can't set close-on-exec flag; fcntl() failed. errno is %d "
             "(%s)\n", errno, strerror(errno));
        palError = ERROR_INTERNAL_ERROR;
        goto done;
    }

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otFile,
        &oaFile,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    if (strcpy_s(pLocalData->unix_filename, sizeof(pLocalData->unix_filename), lpUnixPath) != SAFECRT_SUCCESS)
    {
        palError = ERROR_INSUFFICIENT_BUFFER;
        TRACE("strcpy_s failed!\n");
        goto done;
    }

    pLocalData->inheritable = inheritable;
    pLocalData->unix_fd = filed;
    pLocalData->dwDesiredAccess = dwDesiredAccess;
    pLocalData->open_flags = open_flags;
    pLocalData->open_flags_deviceaccessonly = (dwDesiredAccess == 0);

    //
    // Transfer the lock controller reference from our local variable
    // to the local file data
    //

    pLocalData->pLockController = pLockController;
    pLockController = NULL;

    //
    // We've finished initializing our local data, so release that lock
    //

    pDataLock->ReleaseLock(pThread, TRUE);
    pDataLock = NULL;

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pFileObject,
        &aotFile, 
        dwDesiredAccess,
        phFile,
        &pRegisteredFile
        );

    //
    // pFileObject is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //

    pFileObject = NULL;

done:

    // At this point, if we've been successful, palError will be NO_ERROR.
    // CreateFile can return ERROR_ALREADY_EXISTS in some success cases;
    // those cases are flagged by fFileExists and are handled below.
    if (NO_ERROR != palError)
    {
        if (filed >= 0)
        {
            close(filed);
        }
        if (bFileCreated)
        {
            if (-1 == unlink(lpUnixPath))
            {
                WARN("can't delete file; unlink() failed with errno %d (%s)\n",
                     errno, strerror(errno));
            }
        }
    }

    if (NULL != pLockController)
    {
        pLockController->ReleaseController();
    }

    if (NULL != pDataLock)
    {
        pDataLock->ReleaseLock(pThread, TRUE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    if (NULL != pRegisteredFile)
    {
        pRegisteredFile->ReleaseReference(pThread);
    }
    
    if (NULL != lpUnixPath)
    {
        InternalFree(lpUnixPath);
    }

    if (NULL != lpFullUnixPath)
    {
        InternalFree(lpFullUnixPath);
    }

    if (NO_ERROR == palError && fFileExists)
    {
        palError = ERROR_ALREADY_EXISTS;
    }

    return palError;
}